

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  uint uVar1;
  bool bVar2;
  LogMessage *other;
  FileOptions *pFVar3;
  LogMessage local_58;
  LogFinisher local_19;
  
  bVar2 = internal::AllAreInitialized<google::protobuf::DescriptorProto>(&this->message_type_);
  if ((((bVar2) &&
       (bVar2 = internal::AllAreInitialized<google::protobuf::EnumDescriptorProto>
                          (&this->enum_type_), bVar2)) &&
      (bVar2 = internal::AllAreInitialized<google::protobuf::ServiceDescriptorProto>
                         (&this->service_), bVar2)) &&
     (bVar2 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>(&this->extension_)
     , bVar2)) {
    uVar1 = (this->_has_bits_).has_bits_[0];
    pFVar3 = this->options_;
    if ((pFVar3 == (FileOptions *)0x0 & (byte)uVar1 >> 3) == 1) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.h"
                 ,0x1d1e);
      other = internal::LogMessage::operator<<
                        (&local_58,"CHECK failed: !value || options_ != nullptr: ");
      internal::LogFinisher::operator=(&local_19,other);
      internal::LogMessage::~LogMessage(&local_58);
      pFVar3 = this->options_;
    }
    else if ((uVar1 & 8) == 0) {
      return true;
    }
    bVar2 = internal::ExtensionSet::IsInitialized(&pFVar3->_extensions_);
    if ((bVar2) &&
       (bVar2 = internal::AllAreInitialized<google::protobuf::UninterpretedOption>
                          (&pFVar3->uninterpreted_option_), bVar2)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(message_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(enum_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(service_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(extension_)) return false;
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}